

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_for.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  
  if (argc == 2) {
    iVar1 = atoi(argv[1]);
    for_each(iVar1);
    iVar1 = atoi(argv[1]);
    for_each_by_index(iVar1);
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ./parallel_for num_iterations");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {

  if(argc != 2) {
    std::cerr << "Usage: ./parallel_for num_iterations" << std::endl;
    std::exit(EXIT_FAILURE);
  }

  for_each(std::atoi(argv[1]));
  for_each_by_index(std::atoi(argv[1]));

  return 0;
}